

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

string * __thiscall
camp::BadType::typeName_abi_cxx11_(string *__return_storage_ptr__,BadType *this,Type type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "none";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "boolean";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "integer";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "real";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "string";
    paVar1 = &local_d;
    break;
  case 5:
    pcVar2 = "enum";
    paVar1 = &local_e;
    break;
  case 6:
    pcVar2 = "array";
    paVar1 = &local_f;
    break;
  case 7:
    pcVar2 = "user";
    paVar1 = &local_10;
    break;
  default:
    pcVar2 = "unknown";
    paVar1 = &local_11;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string BadType::typeName(Type type)
{
    switch (type)
    {
        case noType:     return "none";
        case boolType:   return "boolean";
        case intType:    return "integer";
        case realType:   return "real";
        case stringType: return "string";
        case enumType:   return "enum";
        case arrayType:  return "array";
        case userType:   return "user";
        default:         return "unknown";
    }
}